

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

_Bool Curl_conn_data_pending(Curl_easy *data,int sockindex)

{
  _Bool _Var1;
  Curl_cfilter *pCVar2;
  
  pCVar2 = data->conn->cfilter[sockindex];
  while( true ) {
    if (pCVar2 == (Curl_cfilter *)0x0) {
      return false;
    }
    if ((pCVar2->field_0x24 & 1) != 0) break;
    pCVar2 = pCVar2->next;
  }
  _Var1 = (*pCVar2->cft->has_data_pending)(pCVar2,data);
  return _Var1;
}

Assistant:

bool Curl_conn_data_pending(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  (void)data;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    return cf->cft->has_data_pending(cf, data);
  }
  return FALSE;
}